

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int luaB_collectgarbage(lua_State *L)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar1 = luaL_checkoption(L,1,"collect",luaB_collectgarbage::opts);
  iVar1 = luaB_collectgarbage::optsnum[iVar1];
  switch(iVar1) {
  case 3:
    iVar1 = lua_gc(L,3);
    iVar2 = lua_gc(L,4);
    if (iVar1 != -1) {
      lua_pushnumber(L,(double)iVar2 * 0.0009765625 + (double)iVar1);
      return 1;
    }
    goto LAB_00138f1f;
  default:
    iVar1 = lua_gc(L,iVar1);
    break;
  case 5:
    uVar3 = luaL_optinteger(L,2,0);
    iVar1 = lua_gc(L,5,uVar3 & 0xffffffff);
    goto LAB_00138f0e;
  case 6:
  case 7:
    uVar3 = luaL_optinteger(L,2,0);
    iVar1 = lua_gc(L,iVar1,uVar3 & 0xffffffff);
    break;
  case 9:
    iVar1 = lua_gc(L,9);
LAB_00138f0e:
    if (iVar1 != -1) {
      lua_pushboolean(L,iVar1);
      return 1;
    }
    goto LAB_00138f1f;
  case 10:
    uVar3 = luaL_optinteger(L,2,0);
    uVar4 = luaL_optinteger(L,3,0);
    iVar1 = lua_gc(L,10,uVar3 & 0xffffffff,uVar4 & 0xffffffff);
    goto LAB_00138e8b;
  case 0xb:
    uVar3 = luaL_optinteger(L,2,0);
    uVar4 = luaL_optinteger(L,3,0);
    uVar5 = luaL_optinteger(L,4,0);
    iVar1 = lua_gc(L,0xb,uVar3 & 0xffffffff,uVar4 & 0xffffffff,uVar5 & 0xffffffff);
LAB_00138e8b:
    pushmode(L,iVar1);
    return 1;
  }
  if (iVar1 == -1) {
LAB_00138f1f:
    lua_pushnil(L);
  }
  else {
    lua_pushinteger(L,(long)iVar1);
  }
  return 1;
}

Assistant:

static int luaB_collectgarbage (lua_State *L) {
  static const char *const opts[] = {"stop", "restart", "collect",
    "count", "step", "setpause", "setstepmul",
    "isrunning", "generational", "incremental", NULL};
  static const int optsnum[] = {LUA_GCSTOP, LUA_GCRESTART, LUA_GCCOLLECT,
    LUA_GCCOUNT, LUA_GCSTEP, LUA_GCSETPAUSE, LUA_GCSETSTEPMUL,
    LUA_GCISRUNNING, LUA_GCGEN, LUA_GCINC};
  int o = optsnum[luaL_checkoption(L, 1, "collect", opts)];
  switch (o) {
    case LUA_GCCOUNT: {
      int k = lua_gc(L, o);
      int b = lua_gc(L, LUA_GCCOUNTB);
      checkvalres(k);
      lua_pushnumber(L, (lua_Number)k + ((lua_Number)b/1024));
      return 1;
    }
    case LUA_GCSTEP: {
      int step = (int)luaL_optinteger(L, 2, 0);
      int res = lua_gc(L, o, step);
      checkvalres(res);
      lua_pushboolean(L, res);
      return 1;
    }
    case LUA_GCSETPAUSE:
    case LUA_GCSETSTEPMUL: {
      int p = (int)luaL_optinteger(L, 2, 0);
      int previous = lua_gc(L, o, p);
      checkvalres(previous);
      lua_pushinteger(L, previous);
      return 1;
    }
    case LUA_GCISRUNNING: {
      int res = lua_gc(L, o);
      checkvalres(res);
      lua_pushboolean(L, res);
      return 1;
    }
    case LUA_GCGEN: {
      int minormul = (int)luaL_optinteger(L, 2, 0);
      int majormul = (int)luaL_optinteger(L, 3, 0);
      return pushmode(L, lua_gc(L, o, minormul, majormul));
    }
    case LUA_GCINC: {
      int pause = (int)luaL_optinteger(L, 2, 0);
      int stepmul = (int)luaL_optinteger(L, 3, 0);
      int stepsize = (int)luaL_optinteger(L, 4, 0);
      return pushmode(L, lua_gc(L, o, pause, stepmul, stepsize));
    }
    default: {
      int res = lua_gc(L, o);
      checkvalres(res);
      lua_pushinteger(L, res);
      return 1;
    }
  }
  luaL_pushfail(L);  /* invalid call (inside a finalizer) */
  return 1;
}